

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

_Bool progress_calc(Curl_easy *data,curltime now)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [12];
  timediff_t tVar6;
  curl_off_t cVar7;
  curltime *pcVar8;
  long lVar9;
  int iVar10;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  int local_58;
  int local_54;
  curl_off_t amount;
  timediff_t span_ms;
  int checkindex;
  int nowindex;
  int countindex;
  Progress *p;
  _Bool timetoshow;
  Curl_easy *data_local;
  curltime now_local;
  
  lVar9 = now.tv_sec;
  p._7_1_ = false;
  auVar5 = now._0_12_;
  uVar1 = (data->progress).start.tv_sec;
  uVar2 = (data->progress).start.tv_usec;
  older.tv_usec = uVar2;
  older.tv_sec = uVar1;
  newer._12_4_ = 0;
  newer.tv_sec = auVar5._0_8_;
  newer.tv_usec = auVar5._8_4_;
  older._12_4_ = 0;
  tVar6 = Curl_timediff_us(newer,older);
  (data->progress).timespent = tVar6;
  cVar7 = trspeed((data->progress).dl.cur_size,(data->progress).timespent);
  (data->progress).dl.speed = cVar7;
  cVar7 = trspeed((data->progress).ul.cur_size,(data->progress).timespent);
  (data->progress).ul.speed = cVar7;
  if ((data->progress).lastshow != lVar9) {
    iVar10 = (data->progress).speeder_c % 6;
    (data->progress).lastshow = lVar9;
    p._7_1_ = true;
    (data->progress).speeder[iVar10] = (data->progress).dl.cur_size + (data->progress).ul.cur_size;
    pcVar8 = (data->progress).speeder_time + iVar10;
    pcVar8->tv_sec = lVar9;
    *(ulong *)&pcVar8->tv_usec = CONCAT44(now_local.tv_sec._4_4_,now.tv_usec);
    (data->progress).speeder_c = (data->progress).speeder_c + 1;
    if ((data->progress).speeder_c < 6) {
      local_54 = (data->progress).speeder_c;
    }
    else {
      local_54 = 6;
    }
    if (local_54 == 1) {
      (data->progress).current_speed = (data->progress).ul.speed + (data->progress).dl.speed;
    }
    else {
      if ((data->progress).speeder_c < 6) {
        local_58 = 0;
      }
      else {
        local_58 = (data->progress).speeder_c % 6;
      }
      pcVar8 = (data->progress).speeder_time + local_58;
      uVar3 = pcVar8->tv_sec;
      uVar4 = pcVar8->tv_usec;
      older_00.tv_usec = uVar4;
      older_00.tv_sec = uVar3;
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar5._0_8_;
      newer_00.tv_usec = auVar5._8_4_;
      older_00._12_4_ = 0;
      amount = Curl_timediff(newer_00,older_00);
      if (amount == 0) {
        amount = 1;
      }
      lVar9 = (data->progress).speeder[iVar10] - (data->progress).speeder[local_58];
      if (lVar9 < 0x418938) {
        (data->progress).current_speed = (lVar9 * 1000) / amount;
      }
      else {
        (data->progress).current_speed = (long)((double)lVar9 / ((double)amount / 1000.0));
      }
    }
  }
  return p._7_1_;
}

Assistant:

static bool progress_calc(struct Curl_easy *data, struct curltime now)
{
  bool timetoshow = FALSE;
  struct Progress * const p = &data->progress;

  /* The time spent so far (from the start) in microseconds */
  p->timespent = Curl_timediff_us(now, p->start);
  p->dl.speed = trspeed(p->dl.cur_size, p->timespent);
  p->ul.speed = trspeed(p->ul.cur_size, p->timespent);

  /* Calculations done at most once a second, unless end is reached */
  if(p->lastshow != now.tv_sec) {
    int countindex; /* amount of seconds stored in the speeder array */
    int nowindex = p->speeder_c% CURR_TIME;
    p->lastshow = now.tv_sec;
    timetoshow = TRUE;

    /* Let's do the "current speed" thing, with the dl + ul speeds
       combined. Store the speed at entry 'nowindex'. */
    p->speeder[ nowindex ] = p->dl.cur_size + p->ul.cur_size;

    /* remember the exact time for this moment */
    p->speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    p->speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we have filled in three entries etc. */
    countindex = ((p->speeder_c >= CURR_TIME)? CURR_TIME:p->speeder_c) - 1;

    /* first of all, we do not do this if there is no counted seconds yet */
    if(countindex) {
      int checkindex;
      timediff_t span_ms;
      curl_off_t amount;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (p->speeder_c >= CURR_TIME)? p->speeder_c%CURR_TIME:0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_timediff(now, p->speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms = 1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      amount = p->speeder[nowindex]- p->speeder[checkindex];

      if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
        /* the 'amount' value is bigger than would fit in 32 bits if
           multiplied with 1000, so we use the double math for this */
        p->current_speed = (curl_off_t)
          ((double)amount/((double)span_ms/1000.0));
      else
        /* the 'amount' value is small enough to fit within 32 bits even
           when multiplied with 1000 */
        p->current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
    }
    else
      /* the first second we use the average */
      p->current_speed = p->ul.speed + p->dl.speed;

  } /* Calculations end */
  return timetoshow;
}